

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O0

void __thiscall PoissonGenerator::Grid::Grid(Grid *this,int w,int h,float cellSize)

{
  bool bVar1;
  pointer this_00;
  __normal_iterator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_*,_std::vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>_>
  local_40;
  __normal_iterator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_*,_std::vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>_>
  local_38;
  iterator i;
  float cellSize_local;
  int h_local;
  int w_local;
  Grid *this_local;
  
  this->w_ = w;
  this->h_ = h;
  this->cellSize_ = cellSize;
  std::
  vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ::vector(&this->grid_);
  std::
  vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ::resize(&this->grid_,(long)this->h_);
  local_38._M_current =
       (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
       std::
       vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
       ::begin(&this->grid_);
  while( true ) {
    local_40._M_current =
         (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
         std::
         vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
         ::end(&this->grid_);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_*,_std::vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>_>
              ::operator->(&local_38);
    std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::resize
              (this_00,(long)w);
    __gnu_cxx::
    __normal_iterator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_*,_std::vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>_>
    ::operator++(&local_38,0);
  }
  return;
}

Assistant:

Grid(int w, int h, float cellSize) : w_(w), h_(h), cellSize_(cellSize) {
    grid_.resize(h_);
    for (auto i = grid_.begin(); i != grid_.end(); i++) {
      i->resize(w);
    }
  }